

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<BlockStatementAstNode>_> * __thiscall
Parser::parseBlockStatement
          (optional<std::shared_ptr<BlockStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  pointer *this_00;
  int iVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  TokenType type;
  shared_ptr<Token> identifier;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_88 [16];
  undefined1 auStack_78 [8];
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  statements;
  optional<std::shared_ptr<StatementAstNode>_> statement;
  allocator<char> local_32;
  char local_31;
  bool error;
  
  local_31 = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &statements.
              super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"Expected a left curly bracket",
             (allocator<char> *)auStack_78);
  this_00 = &statements.
             super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  type = (TokenType)this;
  expect((Parser *)&stack0xffffffffffffff58,type,(bool *)0x2,(string *)&local_31);
  std::__cxx11::string::~string((string *)this_00);
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cVar4 = local_31;
  do {
    skipWhiteSpace(this);
    TokenBuffer::currentToken((TokenBuffer *)this_00);
    iVar1 = *(int *)&statements.
                     super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[2].
                     super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
    if (iVar1 == 1) {
      local_31 = cVar4;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &statements.
                  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "Expected a right curly bracket to close block",&local_32);
      expect((Parser *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,type,(bool *)0x3,(string *)&local_31);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
      std::__cxx11::string::~string
                ((string *)
                 &statements.
                  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0010acc4:
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<BlockStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<BlockStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_>._M_engaged = false;
LAB_0010ad03:
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::~vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                 *)auStack_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier);
      return __return_storage_ptr__;
    }
    TokenBuffer::currentToken((TokenBuffer *)this_00);
    iVar1 = *(int *)&statements.
                     super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[2].
                     super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
    if (iVar1 == 3) {
      local_31 = cVar4;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &statements.
                  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "Expected a right curly bracket to close block",&local_32);
      expect((Parser *)local_88,type,(bool *)0x3,(string *)&local_31);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
      std::__cxx11::string::~string
                ((string *)
                 &statements.
                  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (local_31 != '\0') goto LAB_0010acc4;
      std::
      make_shared<BlockStatementAstNode,std::vector<std::shared_ptr<StatementAstNode>,std::allocator<std::shared_ptr<StatementAstNode>>>&>
                ((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                  *)&statements.
                     super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar2 = statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
              super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<BlockStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<BlockStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<BlockStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           statements.
           super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<BlockStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<BlockStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_>._M_payload._M_value.
      super___shared_ptr<BlockStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      statements.
      super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<BlockStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<BlockStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<BlockStatementAstNode>_>._M_engaged = true;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
      goto LAB_0010ad03;
    }
    parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)this_00,this);
    cVar3 = '\x01';
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ == '\x01')
    {
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::push_back((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                   *)auStack_78,(value_type *)this_00);
      cVar3 = cVar4;
    }
    cVar4 = cVar3;
    std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)this_00);
  } while( true );
}

Assistant:

const std::optional<std::shared_ptr<BlockStatementAstNode>>
Parser::parseBlockStatement() noexcept {
  bool error = false;

  auto identifier = this->expect(TokenType::LeftCurly, error, "Expected a left curly bracket");

  std::vector<std::shared_ptr<StatementAstNode>> statements;

  while (true) {
    this->skipWhiteSpace();

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
      this->expect(TokenType::RightCurly, error, "Expected a right curly bracket to close block");
      return std::nullopt;
    }

    if (this->tokenBuffer->currentToken()->tokenType == TokenType::RightCurly) {
      this->expect(TokenType::RightCurly, error, "Expected a right curly bracket to close block");
      break;
    }

    auto statement = this->parseStatement();

    if (!statement) {
      error = true;

    } else {
      statements.push_back(statement.value());
    }
  }

  if (error) { return std::nullopt; }

  return std::make_shared<BlockStatementAstNode>(statements);
}